

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

void __thiscall lsh::table::table(table *this,covering *c)

{
  uint uVar1;
  pointer pvVar2;
  uint uVar3;
  uint uVar4;
  uint j;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  vector<bool,_std::allocator<bool>_> c_1;
  vector<bool,_std::allocator<bool>_> v;
  vector<lsh::vector,_std::allocator<lsh::vector>_> m;
  allocator_type local_109;
  table *local_108;
  vector<bool,_std::allocator<bool>_> local_100;
  vector<lsh::vector,_std::allocator<lsh::vector>_> *local_d8;
  ulong local_d0;
  size_type local_c8;
  vector<bool,_std::allocator<bool>_> local_c0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  vector<lsh::vector,_std::allocator<lsh::vector>_> local_58;
  ulong local_38;
  
  (this->vectors_)._M_h._M_buckets = &(this->vectors_)._M_h._M_single_bucket;
  (this->vectors_)._M_h._M_bucket_count = 1;
  (this->vectors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vectors_)._M_h._M_element_count = 0;
  (this->vectors_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8 = &this->masks_;
  (this->vectors_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vectors_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->masks_).super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->masks_).super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->masks_).super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = (ulong)c->radius;
  uVar3 = 2 << ((byte)c->radius & 0x1f);
  local_38 = (ulong)uVar3;
  uVar1 = c->dimensions;
  this->dimensions_ = uVar1;
  uVar6 = (ulong)(uVar3 - 1);
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::reserve(local_d8,uVar6);
  std::
  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::reserve(&this->partitions_,uVar6);
  local_c8 = local_d0 + 1;
  local_58.super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar1 != 0) {
    uVar3 = uVar1;
    do {
      vector::random();
      std::vector<lsh::vector,_std::allocator<lsh::vector>_>::emplace_back<lsh::vector>
                (&local_58,(vector *)&local_98);
      if ((void *)local_98._M_bucket_count != (void *)0x0) {
        operator_delete((void *)local_98._M_bucket_count);
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = 1;
  local_108 = this;
  do {
    local_98._M_buckets = (__buckets_ptr)((ulong)local_98._M_buckets & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_c0,local_c8,(bool *)&local_98,(allocator_type *)&local_100);
    local_98._M_buckets = (__buckets_ptr)((ulong)local_98._M_buckets & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_100,(ulong)uVar1,(bool *)&local_98,&local_109);
    uVar5 = 0;
    uVar6 = local_d0;
    do {
      uVar7 = uVar5 >> 6;
      uVar8 = 1L << ((byte)uVar5 & 0x3f);
      if ((uVar3 >> ((uint)uVar6 & 0x1f) & 1) == 0) {
        uVar8 = ~uVar8 & local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
      }
      else {
        uVar8 = uVar8 | local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
      }
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar7] = uVar8;
      uVar5 = uVar5 + 1;
      bVar9 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar9);
    if (uVar1 != 0) {
      uVar6 = 0;
      do {
        pvVar2 = local_58.super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        vector::vector((vector *)&local_98,&local_c0);
        uVar4 = vector::operator*(pvVar2 + uVar6,(vector *)&local_98);
        uVar5 = uVar6 >> 6;
        uVar7 = 1L << ((byte)uVar6 & 0x3f);
        if ((uVar4 & 1) == 0) {
          uVar7 = ~uVar7 & local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
        }
        else {
          uVar7 = uVar7 | local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
        }
        local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar5] = uVar7;
        if ((void *)local_98._M_bucket_count != (void *)0x0) {
          operator_delete((void *)local_98._M_bucket_count);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1);
    }
    vector::vector((vector *)&local_98,&local_100);
    std::vector<lsh::vector,_std::allocator<lsh::vector>_>::emplace_back<lsh::vector>
              (local_d8,(vector *)&local_98);
    if ((void *)local_98._M_bucket_count != (void *)0x0) {
      operator_delete((void *)local_98._M_bucket_count);
    }
    local_98._M_buckets = &local_98._M_single_bucket;
    local_98._M_bucket_count = 1;
    local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_98._M_element_count = 0;
    local_98._M_rehash_policy._M_max_load_factor = 1.0;
    local_98._M_rehash_policy._4_4_ = 0;
    local_98._M_rehash_policy._M_next_resize = 0;
    local_98._M_single_bucket = (__node_base_ptr)0x0;
    std::
    vector<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,std::allocator<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>>
    ::
    emplace_back<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
              ((vector<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,std::allocator<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>>
                *)&this->partitions_,
               (unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                *)&local_98);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_98);
    if (local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != (uint)local_38);
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::~vector(&local_58);
  return;
}

Assistant:

table::table(const covering& c) {
    unsigned int d = c.dimensions;
    unsigned int r = c.radius;
    unsigned int x = r + 1;
    unsigned int n = 1 << x;

    this->dimensions_ = d;
    this->masks_.reserve(n - 1);
    this->partitions_.reserve(n - 1);

    std::vector<vector> m;

    for (unsigned int i = 0; i < d; i++) {
      m.push_back(vector::random(x));
    }

    for (unsigned int i = 1; i < n; i++) {
      std::vector<bool> v(x);
      std::vector<bool> c(d);

      for (unsigned int j = 0; j < x; j++) {
        v[j] = (i >> (x - j - 1)) & 1;
      }

      for (unsigned int j = 0; j < d; j++) {
        c[j] = (m[j] * v) % 2;
      }

      this->masks_.push_back(vector(c));
      this->partitions_.push_back(partition());
    }
  }